

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_FindForeignInitializationErrors_Test::
TestBody(ReflectionOpsTest_FindForeignInitializationErrors_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestRequired> *this_00;
  Message *message_00;
  char *message_01;
  AssertHelper AStack_88;
  AssertionResult gtest_ar;
  string local_70;
  TestRequiredForeign message;
  
  proto2_unittest::TestRequiredForeign::TestRequiredForeign(&message);
  proto2_unittest::TestRequiredForeign::mutable_optional_message(&message);
  this_00 = &message.field_0._impl_.repeated_message_;
  RepeatedPtrFieldBase::
  Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestRequired>>
            (&this_00->super_RepeatedPtrFieldBase);
  RepeatedPtrFieldBase::
  Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestRequired>>
            (&this_00->super_RepeatedPtrFieldBase);
  internal::(anonymous_namespace)::FindInitializationErrors_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)&message,message_00);
  testing::internal::CmpHelperEQ<char[189],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"optional_message.a,\" \"optional_message.b,\" \"optional_message.c,\" \"repeated_message[0].a,\" \"repeated_message[0].b,\" \"repeated_message[0].c,\" \"repeated_message[1].a,\" \"repeated_message[1].b,\" \"repeated_message[1].c\""
             ,"FindInitializationErrors(message)",
             (char (*) [189])
             "optional_message.a,optional_message.b,optional_message.c,repeated_message[0].a,repeated_message[0].b,repeated_message[0].c,repeated_message[1].a,repeated_message[1].b,repeated_message[1].c"
             ,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message_01 = anon_var_dwarf_651463 + 5;
    }
    else {
      message_01 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x1d6,message_01);
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  proto2_unittest::TestRequiredForeign::~TestRequiredForeign(&message);
  return;
}

Assistant:

TEST(ReflectionOpsTest, FindForeignInitializationErrors) {
  unittest::TestRequiredForeign message;
  message.mutable_optional_message();
  message.add_repeated_message();
  message.add_repeated_message();
  EXPECT_EQ(
      "optional_message.a,"
      "optional_message.b,"
      "optional_message.c,"
      "repeated_message[0].a,"
      "repeated_message[0].b,"
      "repeated_message[0].c,"
      "repeated_message[1].a,"
      "repeated_message[1].b,"
      "repeated_message[1].c",
      FindInitializationErrors(message));
}